

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# circular_view_segment_suite.cpp
# Opt level: O0

void api_suite::api_end(void)

{
  pointer *this;
  iterator ptVar1;
  const_iterator ptVar2;
  undefined1 local_78 [8];
  segment clast;
  segment last;
  segment cfirst;
  segment first;
  circular_view<int,_18446744073709551615UL> span;
  int array [4];
  
  span.member.next = 0;
  this = &first.member.tail;
  vista::circular_view<int,_18446744073709551615UL>::circular_view<4UL,_0>
            ((circular_view<int,_18446744073709551615UL> *)this,
             (value_type (*) [4])&span.member.next);
  join_0x00000010_0x00000000_ =
       (member_storage<int,_18446744073709551615UL>)
       vista::circular_view<int,_18446744073709551615UL>::first_segment
                 ((circular_view<int,_18446744073709551615UL> *)this);
  ptVar1 = vista::span<int,_18446744073709551615UL>::end
                     ((span<int,_18446744073709551615UL> *)&cfirst.member.tail);
  boost::detail::test_impl
            ("first.end() == nullptr",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_segment_suite.cpp"
             ,0x9c,"void api_suite::api_end()",ptVar1 == (iterator)0x0);
  join_0x00000010_0x00000000_ =
       (member_storage<int,_18446744073709551615UL>)
       vista::circular_view<int,_18446744073709551615UL>::first_segment
                 ((circular_view<int,_18446744073709551615UL> *)this);
  ptVar2 = vista::span<int,_18446744073709551615UL>::end
                     ((span<int,_18446744073709551615UL> *)&last.member.tail);
  boost::detail::test_impl
            ("cfirst.end() == nullptr",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_segment_suite.cpp"
             ,0x9e,"void api_suite::api_end()",ptVar2 == (const_iterator)0x0);
  join_0x00000010_0x00000000_ =
       (member_storage<int,_18446744073709551615UL>)
       vista::circular_view<int,_18446744073709551615UL>::last_segment
                 ((circular_view<int,_18446744073709551615UL> *)this);
  ptVar1 = vista::span<int,_18446744073709551615UL>::end
                     ((span<int,_18446744073709551615UL> *)&clast.member.tail);
  boost::detail::test_impl
            ("last.end() == nullptr",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_segment_suite.cpp"
             ,0xa0,"void api_suite::api_end()",ptVar1 == (iterator)0x0);
  _local_78 = (member_storage<int,_18446744073709551615UL>)
              vista::circular_view<int,_18446744073709551615UL>::last_segment
                        ((circular_view<int,_18446744073709551615UL> *)this);
  ptVar2 = vista::span<int,_18446744073709551615UL>::end
                     ((span<int,_18446744073709551615UL> *)local_78);
  boost::detail::test_impl
            ("clast.end() == nullptr",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_segment_suite.cpp"
             ,0xa2,"void api_suite::api_end()",(bool)(-(ptVar2 == (const_iterator)0x0) & 1));
  return;
}

Assistant:

void api_end()
{
    int array[4] = {};
    circular_view<int> span(array);
    {
        auto first = span.first_segment();
        BOOST_TEST(first.end() == nullptr);
        const auto cfirst = span.first_segment();
        BOOST_TEST(cfirst.end() == nullptr);
        auto last = span.last_segment();
        BOOST_TEST(last.end() == nullptr);
        const auto clast = span.last_segment();
        BOOST_TEST(clast.end() == nullptr);
    }
}